

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

char * show_token_sequence(dmr_C *C,token *token,int quote)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  
  if (token == (token *)0x0 && quote == 0) {
    pcVar2 = "<none>";
  }
  else {
    pcVar2 = C->preprocessor_buffer;
    uVar3 = 0;
    lVar4 = 0x122c;
    while (token != &dmrC_eof_token_entry_) {
      if (quote == 0) {
        __s = dmrC_show_token(C,token);
      }
      else {
        __s = dmrC_quote_token(C,token);
      }
      sVar1 = strlen(__s);
      sVar1 = (size_t)(int)sVar1;
      if (0x322a < (long)(uVar3 + lVar4 + sVar1)) {
        dmrC_sparse_error(C,token->pos,"too long token expansion");
        break;
      }
      if ((int)uVar3 != 0) {
        *(undefined1 *)((long)&C->target + lVar4) = 0x20;
        lVar4 = lVar4 + 1;
      }
      memcpy((void *)((long)&C->target + lVar4),__s,sVar1);
      lVar4 = lVar4 + sVar1;
      token = token->next;
      uVar3 = (ulong)(*(uint *)&token->pos >> 0x15 & 1);
    }
    *(undefined1 *)((long)&C->target + lVar4) = 0;
  }
  return pcVar2;
}

Assistant:

static const char *show_token_sequence(struct dmr_C *C, struct token *token, int quote)
{
	char *ptr = C->preprocessor_buffer;
	int whitespace = 0;

	if (!token && !quote)
		return "<none>";
	while (!dmrC_eof_token(token)) {
		const char *val = quote ? dmrC_quote_token(C, token) : dmrC_show_token(C, token);
		int len = (int) strlen(val);

		if (ptr + whitespace + len >= C->preprocessor_buffer + sizeof C->preprocessor_buffer) {
			dmrC_sparse_error(C, token->pos, "too long token expansion");
			break;
		}

		if (whitespace)
			*ptr++ = ' ';
		memcpy(ptr, val, len);
		ptr += len;
		token = token->next;
		whitespace = token->pos.whitespace;
	}
	*ptr = 0;
	return C->preprocessor_buffer;
}